

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::PreSelectedInputs> *
wallet::FetchSelectedInputs
          (Result<wallet::PreSelectedInputs> *__return_storage_ptr__,CWallet *wallet,
          CCoinControl *coin_control,CoinSelectionParams *coin_selection_params)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Chain *pCVar6;
  element_type *peVar7;
  pointer pCVar8;
  COutPoint outpoint;
  optional<CFeeRate> feerate;
  bool bVar9;
  _Base_ptr p_Var10;
  CAmount CVar11;
  bool can_grind_r;
  int iVar12;
  uint uVar13;
  _Rb_tree_color _Var14;
  _Storage<long,_true> nWeight;
  CWalletTx *pCVar15;
  mapped_type *pmVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  CCoinControl *args;
  CFeeRate *pCVar18;
  _Rb_tree_node_base *p_Var19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ulong uVar21;
  _Rb_tree_node_base *p_Var22;
  size_t *psVar23;
  pointer outpoint_00;
  long in_FS_OFFSET;
  optional<long> oVar24;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  map_of_bump_fees;
  PreSelectedInputs result;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  vector<COutPoint,_std::allocator<COutPoint>_> local_308;
  _Storage<CFeeRate,_true> local_2f0;
  undefined1 uStack_2e8;
  undefined7 uStack_2e7;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_2e0 [8];
  _Rb_tree_node_base local_2d8;
  size_t local_2b8;
  CAmount local_2b0;
  _Storage<long,_true> local_2a8 [2];
  _Storage<long,_true> local_298 [2];
  undefined1 local_288 [48];
  void *local_258;
  uint local_23c;
  bilingual_str local_208;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uint32_t local_1a8;
  undefined1 local_198 [40];
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  undefined1 local_130 [32];
  bool local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  CTxOut local_c8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_a0;
  PreSelectedInputs local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70.total_amount = 0;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  can_grind_r = CWallet::CanGrindR(wallet);
  pCVar6 = wallet->m_chain;
  if (pCVar6 == (Chain *)0x0) {
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  CCoinControl::ListSelected
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_2a8,coin_control);
  pCVar18 = &coin_selection_params->m_effective_feerate;
  (**(code **)(*(long *)pCVar6 + 0xb8))(&local_a0,pCVar6,local_2a8);
  if ((_Storage<long,_true> *)local_2a8[0]._M_value != (_Storage<long,_true> *)0x0) {
    operator_delete((void *)local_2a8[0],local_298[0]._M_value - (long)local_2a8[0]);
  }
  CCoinControl::ListSelected(&local_308,coin_control);
  if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x10);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x30);
    outpoint_00 = local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
    do {
      oVar24 = CCoinControl::GetInputWeight(coin_control,outpoint_00);
      nWeight._M_value =
           oVar24.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71((int7)((ulong)pCVar18 >> 8),nWeight._M_value != -1);
      uVar21 = 0xffffffffffffffff;
      if ((oVar24.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged & nWeight._M_value != -1) == 1) {
        uVar21 = GetVirtualTransactionSize(nWeight._M_value,0,0);
      }
      CTxOut::CTxOut(&local_c8);
      pCVar15 = CWallet::GetWalletTx(wallet,(uint256 *)outpoint_00);
      if (pCVar15 == (CWalletTx *)0x0) {
        CCoinControl::GetExternalOutput((optional<CTxOut> *)local_138,coin_control,outpoint_00);
        bVar9 = local_110;
        if (local_110 == false) {
          local_2a8[0]._M_value = (long)local_298;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Not found pre-selected input %s","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_288._0_8_ = local_288 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"Not found pre-selected input %s","");
          }
          else {
            local_198._0_8_ = "Not found pre-selected input %s";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_198);
          }
          COutPoint::ToString_abi_cxx11_((string *)local_198,outpoint_00);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)(local_198 + 0x20),(tinyformat *)local_2a8,
                     (bilingual_str *)local_198,pbVar17);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._32_8_ == &local_168) {
            *puVar1 = CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x18) = local_168._8_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
                 local_198._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x10) =
                 CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
          }
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8)
               = local_170;
          local_170 = 0;
          local_168._M_local_buf[0] = '\0';
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x20) = puVar2;
          if (local_158 == &local_148) {
            *puVar2 = CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x38) = local_148._8_8_;
          }
          else {
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u
                 + 0x20) = local_158;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x30) =
                 CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x28) = local_150;
          local_150 = 0;
          local_148._M_local_buf[0] = '\0';
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\0';
          local_198._32_8_ = &local_168;
          local_158 = &local_148;
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          if ((_Storage<long,_true> *)local_2a8[0]._M_value != local_298) {
            operator_delete((void *)local_2a8[0],local_298[0]._M_value + 1);
          }
        }
        else {
          local_c8.nValue = (CAmount)local_138;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&local_c8.scriptPubKey.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_130);
        }
        if ((local_110 == true) && (local_110 = false, 0x1c < (uint)local_130._28_4_)) {
          free((void *)local_130._0_8_);
        }
        if (bVar9 == false) goto LAB_00239c48;
LAB_002396ae:
        if (uVar21 == 0xffffffffffffffff) {
          local_1a8 = outpoint_00->n;
          local_1c8 = *(undefined8 *)
                       (outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uStack_1c0 = *(undefined8 *)
                        ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_1b8 = *(undefined8 *)
                       ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          uStack_1b0 = *(undefined8 *)
                        ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
          ;
          uVar26 = (undefined4)uStack_1b0;
          uVar27 = (undefined4)((ulong)uStack_1b0 >> 0x20);
          uVar25 = (undefined4)((ulong)uStack_1c0 >> 0x20);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar25;
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
               (char)((uint)uVar25 >> 8);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
               (char)((uint)uVar25 >> 0x10);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
               (char)((uint)uVar25 >> 0x18);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_12_ =
               *(undefined1 (*) [12])
                (outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_1b8;
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
               (char)((ulong)local_1b8 >> 8);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
               (char)((ulong)local_1b8 >> 0x10);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
               (char)((ulong)local_1b8 >> 0x18);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
               (char)((ulong)local_1b8 >> 0x20);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
               (char)((ulong)local_1b8 >> 0x28);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
               (char)((ulong)local_1b8 >> 0x30);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
               (char)((ulong)local_1b8 >> 0x38);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar26;
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
               (char)((uint)uVar26 >> 8);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
               (char)((uint)uVar26 >> 0x10);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
               (char)((uint)uVar26 >> 0x18);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)uVar27;
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
               (char)((uint)uVar27 >> 8);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
               (char)((uint)uVar27 >> 0x10);
          outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
               (char)((uint)uVar27 >> 0x18);
          outpoint.n = local_1a8;
          args = coin_control;
          uVar13 = CalculateMaximumSignedInputSize
                             (&local_c8,outpoint,
                              &(coin_control->m_external_provider).super_SigningProvider,can_grind_r
                              ,coin_control);
          if (uVar13 == 0xffffffff) {
            local_2a8[0]._M_value = (long)local_298;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Not solvable pre-selected input %s","");
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_288._0_8_ = local_288 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"Not solvable pre-selected input %s","");
            }
            else {
              local_138 = (undefined1  [8])0x4aef48;
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_138);
            }
            COutPoint::ToString_abi_cxx11_((string *)local_138,outpoint_00);
            tinyformat::format<std::__cxx11::string>
                      (&local_208,(tinyformat *)local_2a8,(bilingual_str *)local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            *(undefined8 **)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
            paVar4 = &local_208.original.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.original._M_dataplus._M_p == paVar4) {
              *puVar1 = CONCAT71(local_208.original.field_2._M_allocated_capacity._1_7_,
                                 local_208.original.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
               0x18) = local_208.original.field_2._8_8_;
            }
            else {
              *(pointer *)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
                   local_208.original._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                                ._M_u + 0x10) =
                   CONCAT71(local_208.original.field_2._M_allocated_capacity._1_7_,
                            local_208.original.field_2._M_local_buf[0]);
            }
            paVar5 = &local_208.translated.field_2;
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8
             ) = local_208.original._M_string_length;
            local_208.original._M_string_length = 0;
            local_208.original.field_2._M_local_buf[0] = '\0';
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x20) = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.translated._M_dataplus._M_p == paVar5) {
              *puVar2 = CONCAT71(local_208.translated.field_2._M_allocated_capacity._1_7_,
                                 local_208.translated.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
               0x38) = local_208.translated.field_2._8_8_;
            }
            else {
              *(pointer *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                       super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
               0x20) = local_208.translated._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                                super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                                ._M_u + 0x30) =
                   CONCAT71(local_208.translated.field_2._M_allocated_capacity._1_7_,
                            local_208.translated.field_2._M_local_buf[0]);
            }
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x28) = local_208.translated._M_string_length;
            local_208.translated._M_string_length = 0;
            local_208.translated.field_2._M_local_buf[0] = '\0';
            local_208.original._M_dataplus._M_p = (pointer)paVar4;
            local_208.translated._M_dataplus._M_p = (pointer)paVar5;
            goto LAB_00239bd9;
          }
          uVar21 = (ulong)uVar13;
        }
      }
      else {
        peVar7 = (pCVar15->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pCVar8 = (peVar7->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((long)(peVar7->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)pCVar8 >> 3) *
                  -0x3333333333333333);
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)outpoint_00->n;
        if (pbVar20 < pbVar17 || (long)pbVar20 - (long)pbVar17 == 0) {
          local_2a8[0]._M_value = (long)local_298;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Invalid pre-selected input %s","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_288._0_8_ = local_288 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"Invalid pre-selected input %s","");
          }
          else {
            local_138 = (undefined1  [8])0x4aef0a;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_138);
          }
          COutPoint::ToString_abi_cxx11_((string *)local_138,outpoint_00);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)&local_108,(tinyformat *)local_2a8,(bilingual_str *)local_138,
                     pbVar17);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_allocated_capacity == &local_f8) {
            *puVar1 = CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x18) = local_f8._8_8_;
          }
          else {
            *(size_type *)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
                 local_108._M_allocated_capacity;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x10) =
                 CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8)
               = local_108._8_8_;
          local_108._8_8_ = 0;
          local_f8._M_local_buf[0] = '\0';
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x20) = puVar2;
          if (local_e8 == &local_d8) {
            *puVar2 = CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x38) = local_d8._8_8_;
          }
          else {
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u
                 + 0x20) = local_e8;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x30) =
                 CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x28) = local_e0;
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_108._M_allocated_capacity = (size_type)&local_f8;
          local_e8 = &local_d8;
LAB_00239bd9:
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\0';
          if (local_138 != (undefined1  [8])(local_130 + 8)) {
            operator_delete((void *)local_138,local_130._8_8_ + 1);
          }
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          if ((_Storage<long,_true> *)local_2a8[0]._M_value != local_298) {
            operator_delete((void *)local_2a8[0],local_298[0]._M_value + 1);
          }
LAB_00239c48:
          if (0x1c < local_c8.scriptPubKey.super_CScriptBase._size) {
            free(local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
          }
          if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_start != (COutPoint *)0x0) {
            operator_delete(local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_308.
                                  super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_308.
                                  super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          goto LAB_00239c81;
        }
        pCVar8 = pCVar8 + (long)pbVar17;
        local_c8.nValue = pCVar8->nValue;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&local_c8.scriptPubKey.super_CScriptBase,
                   &(pCVar8->scriptPubKey).super_CScriptBase);
        if (uVar21 == 0xffffffffffffffff) {
          iVar12 = CalculateMaximumSignedInputSize(&local_c8,wallet,coin_control);
          uVar21 = (ulong)iVar12;
          goto LAB_002396ae;
        }
      }
      local_2f0 = (_Storage<CFeeRate,_true>)
                  (coin_selection_params->m_effective_feerate).nSatoshisPerK;
      uStack_2e8 = 1;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._9_7_ = uStack_2e7;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged = true;
      pCVar18 = (CFeeRate *)0x0;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload = local_2f0;
      COutput::COutput((COutput *)local_2a8,outpoint_00,&local_c8,0,(int)uVar21,true,true,true,0,
                       false,feerate);
      pmVar16 = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)&local_a0,(key_type *)local_288);
      COutput::ApplyBumpFee((COutput *)local_2a8,*pmVar16);
      PreSelectedInputs::Insert
                (&local_70,(COutput *)local_2a8,coin_selection_params->m_subtract_fee_outputs);
      if (0x1c < local_23c) {
        free(local_258);
      }
      if (0x1c < local_c8.scriptPubKey.super_CScriptBase._size) {
        free(local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      }
      outpoint_00 = outpoint_00 + 1;
    } while (outpoint_00 !=
             local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (COutPoint *)0x0) {
    operator_delete(local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  CVar11 = local_70.total_amount;
  p_Var10 = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    psVar23 = &local_2b8;
    local_2d8._M_parent = (_Base_ptr)0x0;
    local_2d8._M_color = _S_red;
    local_2d8._M_left = &local_2d8;
    local_2d8._M_right = &local_2d8;
  }
  else {
    psVar23 = &local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_2d8._M_parent = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &local_2d8;
    local_2b8 = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = &local_70.coins._M_t._M_impl.super__Rb_tree_header;
    local_2d8._M_left = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d8._M_right = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_2d8._M_color = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  *psVar23 = 0;
  local_2b0 = local_70.total_amount;
  p_Var19 = (_Rb_tree_node_base *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                    super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                    super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                    super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                    super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8)
  ;
  if (p_Var10 == (_Base_ptr)0x0) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x10) = 0
    ;
    psVar23 = (size_t *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
              0x28);
    _Var14 = _S_red;
    p_Var22 = p_Var19;
  }
  else {
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x10) =
         p_Var10;
    p_Var10->_M_parent = p_Var19;
    psVar23 = &local_2b8;
    *(size_t *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x28) =
         local_2b8;
    local_2d8._M_parent = (_Base_ptr)0x0;
    p_Var19 = local_2d8._M_left;
    p_Var22 = local_2d8._M_right;
    _Var14 = local_2d8._M_color;
    local_2d8._M_left = &local_2d8;
    local_2d8._M_right = &local_2d8;
  }
  *(_Rb_tree_node_base **)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x18) =
       p_Var19;
  *(_Rb_tree_node_base **)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x20) =
       p_Var22;
  *psVar23 = 0;
  *(_Rb_tree_color *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8) = _Var14
  ;
  *(CAmount *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x30) =
       CVar11;
  (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
  super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\x01';
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(local_2e0);
LAB_00239c81:
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  ::~_Rb_tree(&local_a0);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<PreSelectedInputs> FetchSelectedInputs(const CWallet& wallet, const CCoinControl& coin_control,
                                            const CoinSelectionParams& coin_selection_params)
{
    PreSelectedInputs result;
    const bool can_grind_r = wallet.CanGrindR();
    std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(coin_control.ListSelected(), coin_selection_params.m_effective_feerate);
    for (const COutPoint& outpoint : coin_control.ListSelected()) {
        int64_t input_bytes = coin_control.GetInputWeight(outpoint).value_or(-1);
        if (input_bytes != -1) {
            input_bytes = GetVirtualTransactionSize(input_bytes, 0, 0);
        }
        CTxOut txout;
        if (auto ptr_wtx = wallet.GetWalletTx(outpoint.hash)) {
            // Clearly invalid input, fail
            if (ptr_wtx->tx->vout.size() <= outpoint.n) {
                return util::Error{strprintf(_("Invalid pre-selected input %s"), outpoint.ToString())};
            }
            txout = ptr_wtx->tx->vout.at(outpoint.n);
            if (input_bytes == -1) {
                input_bytes = CalculateMaximumSignedInputSize(txout, &wallet, &coin_control);
            }
        } else {
            // The input is external. We did not find the tx in mapWallet.
            const auto out{coin_control.GetExternalOutput(outpoint)};
            if (!out) {
                return util::Error{strprintf(_("Not found pre-selected input %s"), outpoint.ToString())};
            }

            txout = *out;
        }

        if (input_bytes == -1) {
            input_bytes = CalculateMaximumSignedInputSize(txout, outpoint, &coin_control.m_external_provider, can_grind_r, &coin_control);
        }

        if (input_bytes == -1) {
            return util::Error{strprintf(_("Not solvable pre-selected input %s"), outpoint.ToString())}; // Not solvable, can't estimate size for fee
        }

        /* Set some defaults for depth, spendable, solvable, safe, time, and from_me as these don't matter for preset inputs since no selection is being done. */
        COutput output(outpoint, txout, /*depth=*/ 0, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, coin_selection_params.m_effective_feerate);
        output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
        result.Insert(output, coin_selection_params.m_subtract_fee_outputs);
    }
    return result;
}